

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_address.cpp
# Opt level: O3

void __thiscall
cfdcapi_elements_address_ConfidentialAddress_Test::TestBody
          (cfdcapi_elements_address_ConfidentialAddress_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  char *addr;
  char *key;
  int ret;
  AssertionResult gtest_ar;
  char *confidential_address;
  void *handle;
  int net_type;
  AssertHelper local_78;
  AssertHelper local_70;
  AssertHelper local_68;
  AssertHelper local_60;
  int local_54;
  string local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  void *local_20;
  int local_14;
  
  local_20 = (void *)0x0;
  local_54 = CfdCreateHandle(&local_20);
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_30.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_30,&local_54);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_30);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ptr_._0_1_ = local_20 != (void *)0x0;
  local_28.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_20 == (void *)0x0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&local_30,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x1b,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                      (char)local_50._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p));
    }
    if (local_78.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_78.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_78.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_54 = CfdCreateConfidentialAddress
                       (local_20,"Q7wegLt2qMGhm28vch6VTzvpzs8KXvs4X7",
                        "025476c2e83188368da1ff3e292e7acafcdb3566bb0ad253f62fc70f07aeee6357",
                        (char **)&local_30);
  local_78.data_ = (AssertHelperData *)((ulong)local_78.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_78.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_78.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_78.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_54 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_50,"kConfidentialAddr","confidential_address",
               "VTpvKKc1SNmLG4H8CnR1fGJdHdyWGEQEvdP9gfeneJR7n81S5kiwNtgF7vrZjC8mp63HvwxM81nEbTxU",
               (char *)local_30.ptr_);
    if ((char)local_50._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_78);
      if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_50._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x27,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_78.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_78.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_78.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_78.data_ = (AssertHelperData *)0x0;
    local_70.data_ = (AssertHelperData *)0x0;
    local_14 = 0;
    local_54 = CfdParseConfidentialAddress
                         (local_20,(char *)local_30.ptr_,(char **)&local_78,(char **)&local_70,
                          &local_14);
    local_68.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&local_54);
    if ((char)local_50._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_50._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x2e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_54 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_50,"kAddress","addr","Q7wegLt2qMGhm28vch6VTzvpzs8KXvs4X7",
                 (char *)local_78.data_);
      if ((char)local_50._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_50._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x30,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_50._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_50,"kConfidentialKey","key",
                 "025476c2e83188368da1ff3e292e7acafcdb3566bb0ad253f62fc70f07aeee6357",
                 (char *)local_70.data_);
      if ((char)local_50._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_50._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x31,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_50._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_50,"kNetworkType","net_type",&TestBody::kNetworkType,&local_14);
      if ((char)local_50._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_68);
        if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_50._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x32,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_50._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_78.data_);
      CfdFreeStringBuffer((char *)local_70.data_);
    }
    CfdFreeStringBuffer((char *)local_30.ptr_);
  }
  local_54 = CfdGetLastErrorCode(local_20);
  if (local_54 != 0) {
    local_78.data_ = (AssertHelperData *)0x0;
    local_54 = CfdGetLastErrorMessage(local_20,(char **)&local_78);
    local_70.data_ = local_70.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&local_54);
    if ((char)local_50._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_50._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x3e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_50,"\"\"","str_buffer","",(char *)local_78.data_);
    if ((char)local_50._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_50._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x3f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_78.data_);
  }
  local_54 = CfdFreeHandle(local_20);
  local_78.data_ = local_78.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_54);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_78.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_78.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_78.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_elements_address, ConfidentialAddress) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* kAddress = "Q7wegLt2qMGhm28vch6VTzvpzs8KXvs4X7";
  static const char* kConfidentialKey = "025476c2e83188368da1ff3e292e7acafcdb3566bb0ad253f62fc70f07aeee6357";
  static const char* kConfidentialAddr = "VTpvKKc1SNmLG4H8CnR1fGJdHdyWGEQEvdP9gfeneJR7n81S5kiwNtgF7vrZjC8mp63HvwxM81nEbTxU";
  static int kNetworkType = kCfdNetworkLiquidv1;

  char* confidential_address = nullptr;
  ret = CfdCreateConfidentialAddress(
      handle, kAddress, kConfidentialKey, &confidential_address);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(kConfidentialAddr, confidential_address);

    char* addr = nullptr;
    char* key = nullptr;
    int net_type = kCfdNetworkMainnet;
    ret = CfdParseConfidentialAddress(
        handle, confidential_address, &addr, &key, &net_type);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(kAddress, addr);
      EXPECT_STREQ(kConfidentialKey, key);
      EXPECT_EQ(kNetworkType, net_type);
      CfdFreeStringBuffer(addr);
      CfdFreeStringBuffer(key);
    }

    CfdFreeStringBuffer(confidential_address);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}